

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O1

int get_comp_index_context(AV1_COMMON *cm,MACROBLOCKD *xd)

{
  byte bVar1;
  int iVar2;
  SequenceHeader *pSVar3;
  MB_MODE_INFO *pMVar4;
  MB_MODE_INFO *pMVar5;
  uint uVar6;
  int iVar7;
  RefCntBuffer *pRVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  RefCntBuffer *pRVar12;
  uint uVar13;
  
  bVar1 = (*xd->mi)->ref_frame[0];
  iVar9 = -1;
  if ((byte)(bVar1 - 1) < 8) {
    iVar9 = cm->remapped_ref_idx[bVar1 - 1];
  }
  if (iVar9 == -1) {
    pRVar8 = (RefCntBuffer *)0x0;
  }
  else {
    pRVar8 = cm->ref_frame_map[iVar9];
  }
  bVar1 = (*xd->mi)->ref_frame[1];
  iVar9 = -1;
  if ((byte)(bVar1 - 1) < 8) {
    iVar9 = cm->remapped_ref_idx[bVar1 - 1];
  }
  uVar10 = 0;
  if (iVar9 == -1) {
    pRVar12 = (RefCntBuffer *)0x0;
  }
  else {
    pRVar12 = cm->ref_frame_map[iVar9];
  }
  if (pRVar8 != (RefCntBuffer *)0x0) {
    uVar10 = pRVar8->order_hint;
  }
  iVar9 = 0;
  uVar6 = 0;
  if (pRVar12 != (RefCntBuffer *)0x0) {
    uVar6 = pRVar12->order_hint;
  }
  uVar11 = cm->cur_frame->order_hint;
  pSVar3 = cm->seq_params;
  iVar2 = (pSVar3->order_hint_info).enable_order_hint;
  if (iVar2 != 0) {
    uVar6 = uVar6 - uVar11;
    uVar13 = 1 << ((byte)(pSVar3->order_hint_info).order_hint_bits_minus_1 & 0x1f);
    iVar9 = (uVar13 - 1 & uVar6) - (uVar13 & uVar6);
  }
  uVar6 = 0;
  iVar7 = 0;
  if (iVar2 != 0) {
    uVar11 = uVar11 - uVar10;
    uVar10 = 1 << ((byte)(pSVar3->order_hint_info).order_hint_bits_minus_1 & 0x1f);
    iVar7 = (uVar10 - 1 & uVar11) - (uVar10 & uVar11);
  }
  pMVar4 = xd->left_mbmi;
  pMVar5 = xd->above_mbmi;
  if (pMVar5 != (MB_MODE_INFO *)0x0) {
    if (pMVar5->ref_frame[1] < '\x01') {
      uVar6 = (uint)(pMVar5->ref_frame[0] == '\a');
    }
    else {
      uVar6 = *(ushort *)&pMVar5->field_0xa7 >> 9 & 1;
    }
  }
  if (pMVar4 == (MB_MODE_INFO *)0x0) {
    uVar10 = 0;
  }
  else if (pMVar4->ref_frame[1] < '\x01') {
    uVar10 = (uint)(pMVar4->ref_frame[0] == '\a');
  }
  else {
    uVar10 = *(ushort *)&pMVar4->field_0xa7 >> 9 & 1;
  }
  iVar2 = -iVar9;
  if (0 < iVar9) {
    iVar2 = iVar9;
  }
  iVar9 = -iVar7;
  if (0 < iVar7) {
    iVar9 = iVar7;
  }
  return uVar6 + uVar10 + (uint)(iVar2 == iVar9) * 3;
}

Assistant:

static inline int get_comp_index_context(const AV1_COMMON *cm,
                                         const MACROBLOCKD *xd) {
  MB_MODE_INFO *mbmi = xd->mi[0];
  const RefCntBuffer *const bck_buf = get_ref_frame_buf(cm, mbmi->ref_frame[0]);
  const RefCntBuffer *const fwd_buf = get_ref_frame_buf(cm, mbmi->ref_frame[1]);
  int bck_frame_index = 0, fwd_frame_index = 0;
  int cur_frame_index = cm->cur_frame->order_hint;

  if (bck_buf != NULL) bck_frame_index = bck_buf->order_hint;
  if (fwd_buf != NULL) fwd_frame_index = fwd_buf->order_hint;

  int fwd = abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                  fwd_frame_index, cur_frame_index));
  int bck = abs(get_relative_dist(&cm->seq_params->order_hint_info,
                                  cur_frame_index, bck_frame_index));

  const MB_MODE_INFO *const above_mi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;

  int above_ctx = 0, left_ctx = 0;
  const int offset = (fwd == bck);

  if (above_mi != NULL) {
    if (has_second_ref(above_mi))
      above_ctx = above_mi->compound_idx;
    else if (above_mi->ref_frame[0] == ALTREF_FRAME)
      above_ctx = 1;
  }

  if (left_mi != NULL) {
    if (has_second_ref(left_mi))
      left_ctx = left_mi->compound_idx;
    else if (left_mi->ref_frame[0] == ALTREF_FRAME)
      left_ctx = 1;
  }

  return above_ctx + left_ctx + 3 * offset;
}